

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  Token *pTVar1;
  Token *pTVar2;
  unsigned_short *puVar3;
  char *pcVar4;
  byte bVar5;
  expkind eVar6;
  SemInfo SVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  BinOpr BVar11;
  Instruction *pIVar12;
  uint uVar13;
  long lVar14;
  OpCode op;
  uint uVar15;
  int *l1;
  FuncState *pFVar16;
  ulong uVar17;
  expdesc v2;
  Value local_70;
  anon_union_8_2_fd02c123_for_u aStack_68;
  undefined8 local_60;
  uint local_54;
  int *local_50;
  SemInfo *local_48;
  Token *local_40;
  Token *local_38;
  
  uVar13 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar13;
  local_54 = limit;
  if (200 < (uVar13 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  pTVar1 = &ls->t;
  iVar10 = (ls->t).token;
  if (iVar10 < 0x113) {
    if (0x106 < iVar10) {
      switch(iVar10) {
      case 0x107:
        v->t = -1;
        v->f = -1;
        v->k = VFALSE;
        break;
      default:
        goto switchD_0010d610_caseD_108;
      case 0x109:
        iVar9 = ls->linenumber;
        iVar10 = (ls->lookahead).token;
        ls->lastline = iVar9;
        if (iVar10 == 0x11f) {
          iVar10 = llex(ls,&(ls->t).seminfo);
          (ls->t).token = iVar10;
          iVar9 = ls->linenumber;
        }
        else {
          pTVar2 = &ls->lookahead;
          uVar8 = *(undefined4 *)&pTVar2->field_0x4;
          SVar7 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar8;
          (ls->t).seminfo = SVar7;
          pTVar2->token = 0x11f;
        }
        body(ls,v,0,iVar9);
        goto LAB_0010d9ac;
      case 0x10d:
        v->t = -1;
        v->f = -1;
        v->k = VNIL;
        break;
      case 0x10e:
        iVar10 = 1;
        goto LAB_0010d7b8;
      }
LAB_0010d747:
      (v->u).s.info = 0;
      goto LAB_0010d773;
    }
    if (iVar10 == 0x23) {
      iVar10 = 2;
    }
    else {
      if (iVar10 != 0x2d) {
        if (iVar10 != 0x7b) goto switchD_0010d610_caseD_108;
        constructor(ls,v);
        goto LAB_0010d9ac;
      }
      iVar10 = 0;
    }
LAB_0010d7b8:
    iVar9 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar9 == 0x11f) {
      iVar9 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar9;
    }
    else {
      pTVar2 = &ls->lookahead;
      uVar8 = *(undefined4 *)&pTVar2->field_0x4;
      SVar7 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar2->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar8;
      (ls->t).seminfo = SVar7;
      pTVar2->token = 0x11f;
    }
    subexpr(ls,v,8);
    pFVar16 = ls->fs;
    local_60 = 0xffffffffffffffff;
    local_70.b = 5;
    aStack_68.nval = 0.0;
    if (iVar10 == 2) {
      luaK_exp2anyreg(pFVar16,v);
      op = OP_LEN;
    }
    else {
      if (iVar10 == 1) {
        luaK_dischargevars(pFVar16,v);
        switch(v->k) {
        case VNIL:
        case VFALSE:
          v->k = VTRUE;
          break;
        case VTRUE:
        case VK:
        case VKNUM:
          v->k = VFALSE;
          break;
        case VJMP:
          lVar14 = (long)(v->u).s.info;
          pIVar12 = pFVar16->f->code + lVar14;
          if ((lVar14 < 1) ||
             (uVar13 = pIVar12[-1], (0x3df07fffffU >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
            uVar13 = *pIVar12;
          }
          else {
            pIVar12 = pIVar12 + -1;
          }
          *pIVar12 = (uint)((uVar13 & 0x3fc0) == 0) << 6 | uVar13 & 0xffffc03f;
          break;
        case VRELOCABLE:
        case VNONRELOC:
          discharge2anyreg(pFVar16,v);
          if (((v->k == VNONRELOC) && (uVar13 = (v->u).s.info, (uVar13 >> 8 & 1) == 0)) &&
             ((int)(uint)pFVar16->nactvar <= (int)uVar13)) {
            pFVar16->freereg = pFVar16->freereg + -1;
          }
          iVar10 = luaK_code(pFVar16,(v->u).s.info << 0x17 | 0x13,pFVar16->ls->lastline);
          (v->u).s.info = iVar10;
          v->k = VRELOCABLE;
        }
        iVar10 = v->t;
        iVar9 = v->f;
        v->f = iVar10;
        v->t = iVar9;
        removevalues(pFVar16,iVar10);
        removevalues(pFVar16,v->t);
        goto LAB_0010d9ac;
      }
      if (((v->k != VKNUM) || (v->t != -1)) || (v->f != -1)) {
        luaK_exp2anyreg(pFVar16,v);
      }
      op = OP_UNM;
    }
    codearith(pFVar16,op,v,(expdesc *)&local_70);
LAB_0010d9ac:
    iVar10 = pTVar1->token;
  }
  else {
    if (iVar10 < 0x11c) {
      if (iVar10 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0010d747;
      }
      if (iVar10 != 0x117) goto switchD_0010d610_caseD_108;
      pFVar16 = ls->fs;
      bVar5 = pFVar16->f->is_vararg;
      if (bVar5 == 0) {
        luaX_lexerror(ls,"cannot use \'...\' outside a vararg function",0x117);
      }
      pFVar16->f->is_vararg = bVar5 & 0xfb;
      iVar10 = luaK_code(pFVar16,0x800025,pFVar16->ls->lastline);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
LAB_0010d6e9:
      (v->u).s.info = iVar10;
    }
    else {
      if (iVar10 != 0x11c) {
        if (iVar10 == 0x11e) {
          local_70 = *(Value *)&(ls->t).seminfo;
          aStack_68.s.info = 4;
          iVar10 = addk(ls->fs,(TValue *)&local_70,(TValue *)&local_70);
          v->t = -1;
          v->f = -1;
          v->k = VK;
          goto LAB_0010d6e9;
        }
switchD_0010d610_caseD_108:
        primaryexp(ls,v);
        goto LAB_0010d9ac;
      }
      v->t = -1;
      v->f = -1;
      v->k = VKNUM;
      (v->u).s.info = 0;
      v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
    }
LAB_0010d773:
    iVar10 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar10 != 0x11f) {
      pTVar2 = &ls->lookahead;
      uVar8 = *(undefined4 *)&pTVar2->field_0x4;
      SVar7 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar2->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar8;
      (ls->t).seminfo = SVar7;
      pTVar2->token = 0x11f;
      goto LAB_0010d9ac;
    }
    iVar10 = llex(ls,&(ls->t).seminfo);
    (ls->t).token = iVar10;
  }
  BVar11 = OPR_NOBINOPR;
  if (iVar10 < 0x5e) {
    switch(iVar10) {
    case 0x25:
      BVar11 = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_0010d9d6_caseD_26;
    case 0x2a:
      BVar11 = OPR_MUL;
      break;
    case 0x2b:
      BVar11 = OPR_ADD;
      break;
    case 0x2d:
      BVar11 = OPR_SUB;
      break;
    case 0x2f:
      BVar11 = OPR_DIV;
      break;
    default:
      if (iVar10 == 0x3c) {
        BVar11 = OPR_LT;
      }
      else {
        if (iVar10 != 0x3e) goto switchD_0010d9d6_caseD_26;
        BVar11 = OPR_GT;
      }
    }
  }
  else {
    switch(iVar10) {
    case 0x10f:
      BVar11 = OPR_OR;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x117:
      goto switchD_0010d9d6_caseD_26;
    case 0x116:
      BVar11 = OPR_CONCAT;
      break;
    case 0x118:
      BVar11 = OPR_EQ;
      break;
    case 0x119:
      BVar11 = OPR_GE;
      break;
    case 0x11a:
      BVar11 = OPR_LE;
      break;
    case 0x11b:
      BVar11 = OPR_NE;
      break;
    default:
      if (iVar10 == 0x5e) {
        BVar11 = OPR_POW;
      }
      else {
        if (iVar10 != 0x101) goto switchD_0010d9d6_caseD_26;
        BVar11 = OPR_AND;
      }
    }
  }
  local_40 = &ls->lookahead;
  local_48 = &(ls->t).seminfo;
  local_50 = &v->t;
  local_38 = pTVar1;
  do {
    uVar17 = (ulong)BVar11;
    if (priority[uVar17].left <= local_54) goto switchD_0010d9d6_caseD_26;
    iVar10 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar10 == 0x11f) {
      iVar10 = llex(ls,local_48);
      (ls->t).token = iVar10;
    }
    else {
      uVar8 = *(undefined4 *)&local_40->field_0x4;
      SVar7 = local_40->seminfo;
      local_38->token = local_40->token;
      *(undefined4 *)&local_38->field_0x4 = uVar8;
      local_38->seminfo = SVar7;
      local_40->token = 0x11f;
    }
    pFVar16 = ls->fs;
    switch(uVar17) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      if (((v->k == VKNUM) && (*local_50 == -1)) && (v->f == -1)) goto LAB_0010db38;
    default:
      luaK_exp2RK(pFVar16,v);
LAB_0010db38:
      subexpr(ls,(expdesc *)&local_70,(uint)priority[uVar17].right);
      iVar10 = *(int *)(&DAT_00115330 + uVar17 * 4);
      pcVar4 = (char *)((long)&UINT_00115390 + (long)iVar10 + 3);
      *pcVar4 = *pcVar4 + '0';
      BVar11 = (*(code *)(&DAT_00115330 +
                         CONCAT71((int7)((ulong)(&DAT_00115330 + iVar10) >> 8),
                                  (char)(&DAT_00115330 + iVar10) + -0x7f)))();
      return BVar11;
    case 6:
      luaK_exp2nextreg(pFVar16,v);
      BVar11 = subexpr(ls,(expdesc *)&local_70,(uint)priority[uVar17].right);
      pFVar16 = ls->fs;
      luaK_exp2val(pFVar16,(expdesc *)&local_70);
      if (local_70.b == 0xb) {
        pIVar12 = pFVar16->f->code;
        lVar14 = (long)aStack_68.s.info;
        uVar13 = pIVar12[lVar14];
        if ((uVar13 & 0x3f) != 0x15) goto LAB_0010dc17;
        uVar15 = (v->u).s.info;
        if (((uVar15 & 0x100) == 0 && v->k == VNONRELOC) &&
           ((int)(uint)pFVar16->nactvar <= (int)uVar15)) {
          pFVar16->freereg = pFVar16->freereg + -1;
          uVar13 = pIVar12[lVar14];
          uVar15 = (v->u).s.info;
        }
        pIVar12[lVar14] = uVar15 << 0x17 | uVar13 & 0x7fffff;
        v->k = VRELOCABLE;
        (v->u).s.info = aStack_68.s.info;
      }
      else {
LAB_0010dc17:
        luaK_exp2nextreg(pFVar16,(expdesc *)&local_70);
        codearith(pFVar16,OP_CONCAT,v,(expdesc *)&local_70);
      }
      goto LAB_0010ddc7;
    case 0xd:
      luaK_goiftrue(pFVar16,v);
      BVar11 = subexpr(ls,(expdesc *)&local_70,(uint)priority[uVar17].right);
      pFVar16 = ls->fs;
      luaK_dischargevars(pFVar16,(expdesc *)&local_70);
      iVar10 = v->f;
      l1 = (int *)((long)&local_60 + 4);
      break;
    case 0xe:
      luaK_dischargevars(pFVar16,v);
      eVar6 = v->k;
      iVar10 = -1;
      if ((eVar6 != VNIL) && (eVar6 != VFALSE)) {
        if (eVar6 == VJMP) {
          iVar10 = (v->u).s.info;
        }
        else {
          iVar10 = jumponcond(pFVar16,v,1);
        }
      }
      luaK_concat(pFVar16,local_50,iVar10);
      iVar10 = v->f;
      pFVar16->lasttarget = pFVar16->pc;
      luaK_concat(pFVar16,&pFVar16->jpc,iVar10);
      v->f = -1;
      BVar11 = subexpr(ls,(expdesc *)&local_70,(uint)priority[uVar17].right);
      pFVar16 = ls->fs;
      luaK_dischargevars(pFVar16,(expdesc *)&local_70);
      iVar10 = v->t;
      l1 = (int *)&local_60;
    }
    luaK_concat(pFVar16,l1,iVar10);
    v->t = (undefined4)local_60;
    v->f = local_60._4_4_;
    *(Value *)v = local_70;
    v->u = aStack_68;
LAB_0010ddc7:
  } while (BVar11 != OPR_NOBINOPR);
  BVar11 = OPR_NOBINOPR;
switchD_0010d9d6_caseD_26:
  puVar3 = &ls->L->nCcalls;
  *puVar3 = *puVar3 - 1;
  return BVar11;
}

Assistant:

static BinOpr subexpr(LexState*ls,expdesc*v,unsigned int limit){
BinOpr op;
UnOpr uop;
enterlevel(ls);
uop=getunopr(ls->t.token);
if(uop!=OPR_NOUNOPR){
luaX_next(ls);
subexpr(ls,v,8);
luaK_prefix(ls->fs,uop,v);
}
else simpleexp(ls,v);
op=getbinopr(ls->t.token);
while(op!=OPR_NOBINOPR&&priority[op].left>limit){
expdesc v2;
BinOpr nextop;
luaX_next(ls);
luaK_infix(ls->fs,op,v);
nextop=subexpr(ls,&v2,priority[op].right);
luaK_posfix(ls->fs,op,v,&v2);
op=nextop;
}
leavelevel(ls);
return op;
}